

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utFBXImporterExporter.cpp
# Opt level: O0

void __thiscall
utFBXImporterExporter_importCubesWithUnicodeDuplicatedNames_Test::TestBody
          (utFBXImporterExporter_importCubesWithUnicodeDuplicatedNames_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_3b8;
  Message local_3b0;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar_7;
  AssertHelper local_378;
  Message local_370;
  undefined1 local_368 [8];
  AssertionResult gtest_ar__8;
  aiNode *child10;
  Message local_348;
  uint local_33c;
  undefined1 local_338 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_308;
  Message local_300;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar__7;
  Message local_2e0;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_2a8;
  Message local_2a0;
  undefined1 local_298 [8];
  AssertionResult gtest_ar__6;
  aiNode *child1;
  Message local_278;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_240;
  Message local_238;
  undefined1 local_230 [8];
  AssertionResult gtest_ar__5;
  aiNode *child00;
  Message local_210;
  uint local_204;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_1d0;
  Message local_1c8;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar__4;
  Message local_1a8;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_170;
  Message local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar__3;
  aiNode *child0;
  Message local_140;
  uint local_134;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_100;
  Message local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar__2;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar;
  aiNode *root;
  AssertHelper local_98;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  string local_70;
  AssertHelper local_50;
  Message local_48;
  undefined1 local_40 [8];
  AssertionResult gtest_ar_;
  aiScene *local_20;
  aiScene *scene;
  Importer importer;
  utFBXImporterExporter_importCubesWithUnicodeDuplicatedNames_Test *this_local;
  
  importer.pimpl = (ImporterPimpl *)this;
  Assimp::Importer::Importer((Importer *)&scene);
  local_20 = Assimp::Importer::ReadFile
                       ((Importer *)&scene,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/FBX/cubes_with_names.fbx"
                        ,0x400);
  testing::AssertionResult::AssertionResult<aiScene_const*>
            ((AssertionResult *)local_40,&local_20,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,(internal *)local_40,(AssertionResult *)0xc6d25a,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0x72,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    testing::Message::~Message(&local_48);
  }
  gtest_ar__1.message_.ptr_._5_3_ = 0;
  gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
    testing::AssertionResult::AssertionResult<aiNode*>
              ((AssertionResult *)local_88,&local_20->mRootNode,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&root,(internal *)local_88,(AssertionResult *)"scene->mRootNode","false",
                 "true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                 ,0x74,pcVar2);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      std::__cxx11::string::~string((string *)&root);
      testing::Message::~Message(&local_90);
    }
    gtest_ar__1.message_.ptr_._5_3_ = 0;
    gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_20->mRootNode;
      pcVar2 = aiString::C_Str((aiString *)gtest_ar.message_.ptr_);
      testing::internal::CmpHelperSTREQ
                ((internal *)local_d0,"root->mName.C_Str()","\"RootNode\"",pcVar2,"RootNode");
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
      if (!bVar1) {
        testing::Message::Message(&local_d8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__2.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                   ,0x76,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_d8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_d8);
      }
      gtest_ar__1.message_.ptr_._5_3_ = 0;
      gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
      if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
        testing::AssertionResult::AssertionResult<aiNode**>
                  ((AssertionResult *)local_f0,
                   (aiNode ***)((long)&gtest_ar.message_.ptr_[0x22].field_2 + 8),(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
        if (!bVar1) {
          testing::Message::Message(&local_f8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_1.message_,(internal *)local_f0,
                     (AssertionResult *)"root->mChildren","false","true",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_100,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                     ,0x77,pcVar2);
          testing::internal::AssertHelper::operator=(&local_100,&local_f8);
          testing::internal::AssertHelper::~AssertHelper(&local_100);
          std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
          testing::Message::~Message(&local_f8);
        }
        gtest_ar__1.message_.ptr_._5_3_ = 0;
        gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
        if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
          local_134 = 2;
          testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                    ((EqHelper<false> *)local_130,"root->mNumChildren","2u",
                     (uint *)&gtest_ar.message_.ptr_[0x22].field_2._M_allocated_capacity,&local_134)
          ;
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
          if (!bVar1) {
            testing::Message::Message(&local_140);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&child0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                       ,0x78,pcVar2);
            testing::internal::AssertHelper::operator=((AssertHelper *)&child0,&local_140);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&child0);
            testing::Message::~Message(&local_140);
          }
          gtest_ar__1.message_.ptr_._5_3_ = 0;
          gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
          if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
            gtest_ar__3.message_.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 **(undefined8 **)((long)&gtest_ar.message_.ptr_[0x22].field_2 + 8);
            testing::AssertionResult::AssertionResult<aiNode*>
                      ((AssertionResult *)local_160,(aiNode **)&gtest_ar__3.message_,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
            if (!bVar1) {
              testing::Message::Message(&local_168);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_2.message_,(internal *)local_160,
                         (AssertionResult *)"child0","false","true",in_R9);
              pcVar2 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                         ,0x7b,pcVar2);
              testing::internal::AssertHelper::operator=(&local_170,&local_168);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
              testing::Message::~Message(&local_168);
            }
            gtest_ar__1.message_.ptr_._5_3_ = 0;
            gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
            if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
              pcVar2 = aiString::C_Str((aiString *)gtest_ar__3.message_.ptr_);
              testing::internal::CmpHelperSTREQ
                        ((internal *)local_1a0,"child0->mName.C_Str()","\"Cube2\"",pcVar2,"Cube2");
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
              if (!bVar1) {
                testing::Message::Message(&local_1a8);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar__4.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                           ,0x7c,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar__4.message_,&local_1a8);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar__4.message_);
                testing::Message::~Message(&local_1a8);
              }
              gtest_ar__1.message_.ptr_._5_3_ = 0;
              gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
              if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                testing::AssertionResult::AssertionResult<aiNode**>
                          ((AssertionResult *)local_1c0,
                           (aiNode ***)((long)&gtest_ar__3.message_.ptr_[0x22].field_2 + 8),
                           (type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_1c0);
                if (!bVar1) {
                  testing::Message::Message(&local_1c8);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar_3.message_,(internal *)local_1c0,
                             (AssertionResult *)"child0->mChildren","false","true",in_R9);
                  pcVar2 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_1d0,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                             ,0x7d,pcVar2);
                  testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
                  testing::internal::AssertHelper::~AssertHelper(&local_1d0);
                  std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
                  testing::Message::~Message(&local_1c8);
                }
                gtest_ar__1.message_.ptr_._5_3_ = 0;
                gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
                if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                  local_204 = 1;
                  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                            ((EqHelper<false> *)local_200,"child0->mNumChildren","1u",
                             (uint *)&gtest_ar__3.message_.ptr_[0x22].field_2._M_allocated_capacity,
                             &local_204);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_200);
                  if (!bVar1) {
                    testing::Message::Message(&local_210);
                    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_200)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&child00,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                               ,0x7e,pcVar2);
                    testing::internal::AssertHelper::operator=((AssertHelper *)&child00,&local_210);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&child00);
                    testing::Message::~Message(&local_210);
                  }
                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                  gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                    gtest_ar__5.message_.ptr_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         **(undefined8 **)((long)&gtest_ar__3.message_.ptr_[0x22].field_2 + 8);
                    testing::AssertionResult::AssertionResult<aiNode*>
                              ((AssertionResult *)local_230,(aiNode **)&gtest_ar__5.message_,
                               (type *)0x0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_230);
                    if (!bVar1) {
                      testing::Message::Message(&local_238);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar_4.message_,(internal *)local_230,
                                 (AssertionResult *)"child00","false","true",in_R9);
                      pcVar2 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_240,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                                 ,0x81,pcVar2);
                      testing::internal::AssertHelper::operator=(&local_240,&local_238);
                      testing::internal::AssertHelper::~AssertHelper(&local_240);
                      std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
                      testing::Message::~Message(&local_238);
                    }
                    gtest_ar__1.message_.ptr_._5_3_ = 0;
                    gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
                    if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                      pcVar2 = aiString::C_Str((aiString *)gtest_ar__5.message_.ptr_);
                      testing::internal::CmpHelperSTREQ
                                ((internal *)local_270,"child00->mName.C_Str()",
                                 "\"\\xd0\\x9a\\xd1\\x83\\xd0\\xb1\\x31\"",pcVar2,
                                 anon_var_dwarf_d6f42);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_270);
                      if (!bVar1) {
                        testing::Message::Message(&local_278);
                        pcVar2 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_270);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&child1,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                                   ,0x82,pcVar2);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&child1,&local_278);
                        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&child1);
                        testing::Message::~Message(&local_278);
                      }
                      gtest_ar__1.message_.ptr_._5_3_ = 0;
                      gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
                      if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                        gtest_ar__6.message_.ptr_ =
                             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                              (*(long *)((long)&gtest_ar.message_.ptr_[0x22].field_2 + 8) + 8);
                        testing::AssertionResult::AssertionResult<aiNode*>
                                  ((AssertionResult *)local_298,(aiNode **)&gtest_ar__6.message_,
                                   (type *)0x0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_298);
                        if (!bVar1) {
                          testing::Message::Message(&local_2a0);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&gtest_ar_5.message_,(internal *)local_298,
                                     (AssertionResult *)"child1","false","true",in_R9);
                          pcVar2 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_2a8,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                                     ,0x85,pcVar2);
                          testing::internal::AssertHelper::operator=(&local_2a8,&local_2a0);
                          testing::internal::AssertHelper::~AssertHelper(&local_2a8);
                          std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
                          testing::Message::~Message(&local_2a0);
                        }
                        gtest_ar__1.message_.ptr_._5_3_ = 0;
                        gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
                        if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                          pcVar2 = aiString::C_Str((aiString *)gtest_ar__6.message_.ptr_);
                          testing::internal::CmpHelperSTREQ
                                    ((internal *)local_2d8,"child1->mName.C_Str()","\"Cube3\"",
                                     pcVar2,"Cube3");
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_2d8);
                          if (!bVar1) {
                            testing::Message::Message(&local_2e0);
                            pcVar2 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_2d8);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar__7.message_,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                                       ,0x86,pcVar2);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar__7.message_,&local_2e0);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar__7.message_);
                            testing::Message::~Message(&local_2e0);
                          }
                          gtest_ar__1.message_.ptr_._5_3_ = 0;
                          gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
                          if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                            testing::AssertionResult::AssertionResult<aiNode**>
                                      ((AssertionResult *)local_2f8,
                                       (aiNode ***)
                                       ((long)&gtest_ar__6.message_.ptr_[0x22].field_2 + 8),
                                       (type *)0x0);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_2f8);
                            if (!bVar1) {
                              testing::Message::Message(&local_300);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&gtest_ar_6.message_,(internal *)local_2f8,
                                         (AssertionResult *)"child1->mChildren","false","true",in_R9
                                        );
                              pcVar2 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_308,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                                         ,0x87,pcVar2);
                              testing::internal::AssertHelper::operator=(&local_308,&local_300);
                              testing::internal::AssertHelper::~AssertHelper(&local_308);
                              std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
                              testing::Message::~Message(&local_300);
                            }
                            gtest_ar__1.message_.ptr_._5_3_ = 0;
                            gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8)
                            ;
                            if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                              local_33c = 1;
                              testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                                        ((EqHelper<false> *)local_338,"child1->mNumChildren","1u",
                                         (uint *)&gtest_ar__6.message_.ptr_[0x22].field_2.
                                                  _M_allocated_capacity,&local_33c);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_338);
                              if (!bVar1) {
                                testing::Message::Message(&local_348);
                                pcVar2 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_338);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&child10,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                                           ,0x88,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&child10,&local_348);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&child10);
                                testing::Message::~Message(&local_348);
                              }
                              gtest_ar__1.message_.ptr_._5_3_ = 0;
                              gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_338);
                              if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                gtest_ar__8.message_.ptr_ =
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)**(undefined8 **)
                                          ((long)&gtest_ar__6.message_.ptr_[0x22].field_2 + 8);
                                testing::AssertionResult::AssertionResult<aiNode*>
                                          ((AssertionResult *)local_368,
                                           (aiNode **)&gtest_ar__8.message_,(type *)0x0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_368);
                                if (!bVar1) {
                                  testing::Message::Message(&local_370);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)&gtest_ar_7.message_,(internal *)local_368,
                                             (AssertionResult *)"child10","false","true",in_R9);
                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_378,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                                             ,0x8b,pcVar2);
                                  testing::internal::AssertHelper::operator=(&local_378,&local_370);
                                  testing::internal::AssertHelper::~AssertHelper(&local_378);
                                  std::__cxx11::string::~string((string *)&gtest_ar_7.message_);
                                  testing::Message::~Message(&local_370);
                                }
                                gtest_ar__1.message_.ptr_._5_3_ = 0;
                                gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_368);
                                if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                  pcVar2 = aiString::C_Str((aiString *)gtest_ar__8.message_.ptr_);
                                  testing::internal::CmpHelperSTREQ
                                            ((internal *)local_3a8,"child10->mName.C_Str()",
                                             "\"\\xd0\\x9a\\xd1\\x83\\xd0\\xb1\\x31\"\"001\"",pcVar2
                                             ,anon_var_dwarf_d6f76);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_3a8);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_3b0);
                                    pcVar2 = testing::AssertionResult::failure_message
                                                       ((AssertionResult *)local_3a8);
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_3b8,kFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                                               ,0x8c,pcVar2);
                                    testing::internal::AssertHelper::operator=
                                              (&local_3b8,&local_3b0);
                                    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
                                    testing::Message::~Message(&local_3b0);
                                  }
                                  gtest_ar__1.message_.ptr_._5_3_ = 0;
                                  gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_3a8);
                                  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
                                    gtest_ar__1.message_.ptr_._4_4_ = 0;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  Assimp::Importer::~Importer((Importer *)&scene);
  return;
}

Assistant:

TEST_F(utFBXImporterExporter, importCubesWithUnicodeDuplicatedNames) {
    Assimp::Importer importer;
    const aiScene *scene = importer.ReadFile(ASSIMP_TEST_MODELS_DIR "/FBX/cubes_with_names.fbx", aiProcess_ValidateDataStructure);
    ASSERT_TRUE(scene);

    ASSERT_TRUE(scene->mRootNode);
    const auto root = scene->mRootNode;
    ASSERT_STREQ(root->mName.C_Str(), "RootNode");
    ASSERT_TRUE(root->mChildren);
    ASSERT_EQ(root->mNumChildren, 2u);

    const auto child0 = root->mChildren[0];
    ASSERT_TRUE(child0);
    ASSERT_STREQ(child0->mName.C_Str(), "Cube2");
    ASSERT_TRUE(child0->mChildren);
    ASSERT_EQ(child0->mNumChildren, 1u);

    const auto child00 = child0->mChildren[0];
    ASSERT_TRUE(child00);
    ASSERT_STREQ(child00->mName.C_Str(), "\xd0\x9a\xd1\x83\xd0\xb1\x31");

    const auto child1 = root->mChildren[1];
    ASSERT_TRUE(child1);
    ASSERT_STREQ(child1->mName.C_Str(), "Cube3");
    ASSERT_TRUE(child1->mChildren);
    ASSERT_EQ(child1->mNumChildren, 1u);

    const auto child10 = child1->mChildren[0];
    ASSERT_TRUE(child10);
    ASSERT_STREQ(child10->mName.C_Str(), "\xd0\x9a\xd1\x83\xd0\xb1\x31""001");
}